

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

int __thiscall libtorrent::aux::session_impl::pause(session_impl *this)

{
  pointer psVar1;
  int in_EAX;
  undefined8 extraout_RAX;
  undefined8 uVar2;
  undefined8 extraout_RAX_00;
  shared_ptr<libtorrent::aux::torrent> *te;
  pointer psVar3;
  
  if (this->m_paused == false) {
    session_log(this," *** session paused ***");
    tracker_manager::abort_all_requests(&this->m_tracker_manager,false);
    this->m_paused = true;
    psVar1 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar2 = extraout_RAX;
    for (psVar3 = (this->m_torrents).m_array.
                  super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; in_EAX = (int)uVar2, psVar3 != psVar1;
        psVar3 = psVar3 + 1) {
      torrent::set_session_paused
                ((psVar3->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr,true);
      uVar2 = extraout_RAX_00;
    }
  }
  return in_EAX;
}

Assistant:

void session_impl::pause()
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_paused) return;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** session paused ***");
#endif
		// this will abort all tracker announces other than event=stopped
		m_tracker_manager.abort_all_requests();

		m_paused = true;
		for (auto& te : m_torrents)
		{
			te->set_session_paused(true);
		}
	}